

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_dbra(m68k_info *info)

{
  uint uVar1;
  int displacement;
  
  uVar1 = read_imm_16(info);
  displacement = (uint)(uVar1 < 0x8000) * 0x10000;
  build_dbxx(info,0x4b,displacement + uVar1 + -0x10000,displacement);
  return;
}

Assistant:

static void d68000_dbra(m68k_info *info)
{
	build_dbxx(info, M68K_INS_DBRA, 0, make_int_16(read_imm_16(info)));
}